

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_close(int s)

{
  int iVar1;
  int *piVar2;
  nn_sock *sock;
  
  nn_glock_lock();
  iVar1 = nn_global_hold_socket_locked(&sock,s);
  if (iVar1 < 0) {
    nn_glock_unlock();
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  else {
    nn_sock_stop(sock);
    nn_sock_rele(sock);
    nn_sock_rele(sock);
    nn_glock_unlock();
    iVar1 = nn_sock_term(sock);
    if (iVar1 != -4) {
      nn_glock_lock();
      self.socks[s] = (nn_sock *)0x0;
      self.unused[0x200 - self.nsocks] = (uint16_t)s;
      self.nsocks = self.nsocks - 1;
      nn_free(sock);
      nn_global_term();
      nn_glock_unlock();
      return 0;
    }
    nn_global_rele_socket(sock);
    piVar2 = __errno_location();
    *piVar2 = 4;
  }
  return -1;
}

Assistant:

int nn_close (int s)
{
    int rc;
    struct nn_sock *sock;

    nn_glock_lock ();
    rc = nn_global_hold_socket_locked (&sock, s);
    if (nn_slow (rc < 0)) {
        nn_glock_unlock ();
        errno = -rc;
        return -1;
    }

    /*  Start the shutdown process on the socket.  This will cause
        all other socket users, as well as endpoints, to begin cleaning up.
        This is done with the glock held to ensure that two instances
        of nn_close can't access the same socket. */
    nn_sock_stop (sock);

    /*  We have to drop both the hold we just acquired, as well as
        the original hold, in order for nn_sock_term to complete. */
    nn_sock_rele (sock);
    nn_sock_rele (sock);
    nn_glock_unlock ();

    /*  Now clean up.  The termination routine below will block until
        all other consumers of the socket have dropped their holds, and
        all endpoints have cleanly exited. */
    rc = nn_sock_term (sock);
    if (nn_slow (rc == -EINTR)) {
        nn_global_rele_socket (sock);
        errno = EINTR;
        return -1;
    }

    /*  Remove the socket from the socket table, add it to unused socket
        table. */
    nn_glock_lock ();
    self.socks [s] = NULL;
    self.unused [NN_MAX_SOCKETS - self.nsocks] = s;
    --self.nsocks;
    nn_free (sock);

    /*  Destroy the global context if there's no socket remaining. */
    nn_global_term ();

    nn_glock_unlock ();

    return 0;
}